

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::dht_get_mutable_item
          (session_impl *this,array<char,_32UL> key,string *salt)

{
  bool bVar1;
  element_type *this_00;
  pointer b;
  string local_a8;
  session_impl *local_88;
  code *local_80;
  undefined8 local_78;
  type local_70;
  function<void_(const_libtorrent::dht::item_&,_bool)> local_58;
  public_key local_38;
  string *local_18;
  string *salt_local;
  session_impl *this_local;
  
  local_18 = salt;
  salt_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_dht);
    b = ::std::array<char,_32UL>::data(&key);
    libtorrent::dht::public_key::public_key(&local_38,b);
    local_80 = get_mutable_callback;
    local_78 = 0;
    local_88 = this;
    ::std::
    bind<void(libtorrent::aux::session_impl::*)(libtorrent::dht::item_const&,bool),libtorrent::aux::session_impl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_70,(offset_in_session_impl_to_subr *)&local_80,&local_88,
               (_Placeholder<1> *)&::std::placeholders::_1,
               (_Placeholder<2> *)&::std::placeholders::_2);
    ::std::function<void(libtorrent::dht::item_const&,bool)>::
    function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::dht::item_const&,bool)>,void>
              ((function<void(libtorrent::dht::item_const&,bool)> *)&local_58,&local_70);
    ::std::__cxx11::string::string((string *)&local_a8,(string *)salt);
    libtorrent::dht::dht_tracker::get_item(this_00,&local_38,&local_58,&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::function<void_(const_libtorrent::dht::item_&,_bool)>::~function(&local_58);
  }
  return;
}

Assistant:

void session_impl::dht_get_mutable_item(std::array<char, 32> key
		, std::string salt)
	{
		if (!m_dht) return;
		m_dht->get_item(dht::public_key(key.data()), std::bind(&session_impl::get_mutable_callback
			, this, _1, _2), std::move(salt));
	}